

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::ExtensionRangeOptions::_InternalSerialize
          (ExtensionRangeOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  FeatureSet *value;
  bool bVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ExtensionRangeOptions_Declaration>_>
  *value_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_01;
  uint8_t *puVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      value_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ExtensionRangeOptions_Declaration>>
                           (&(this->field_0)._impl_.declaration_.super_RepeatedPtrFieldBase,iVar8);
      target = internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar8 = iVar8 + 1;
    } while (iVar1 != iVar8);
  }
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (ulong)(this->field_0)._impl_.verification_;
    pbVar5 = target + 1;
    *target = 0x18;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    target = pbVar5 + 1;
  }
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (0x32,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target
                        ,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      value_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                            ,iVar8);
      target = internal::WireFormatLite::InternalWriteMessage
                         (999,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_
                          ,target,stream);
      iVar8 = iVar8 + 1;
    } while (iVar1 != iVar8);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_ExtensionRangeOptions_default_instance_,target,stream);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ExtensionRangeOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ExtensionRangeOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ExtensionRangeOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.ExtensionRangeOptions.Declaration declaration = 2 [retention = RETENTION_SOURCE];
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_declaration_size());
       i < n; i++) {
    const auto& repfield = this_._internal_declaration().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.ExtensionRangeOptions.VerificationState verification = 3 [default = UNVERIFIED, retention = RETENTION_SOURCE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_verification(), target);
  }

  // optional .google.protobuf.FeatureSet features = 50;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        50, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ExtensionRangeOptions)
  return target;
}